

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::EnhancedLayouts::BufferTestBase::testCase(BufferTestBase *this,GLuint test_case_index)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  TestLog *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar4;
  undefined4 in_register_00000034;
  long *local_598 [2];
  long local_588 [2];
  long *local_578;
  long local_570;
  long local_568 [2];
  long *local_558;
  long local_550;
  long local_548 [2];
  VertexArray vao;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  Vector descriptors;
  bufferCollection buffers;
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  Program program;
  NameVector captured_varyings;
  stringstream stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [7];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  buffers.m_vector.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffers.m_vector.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buffers.m_vector.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  captured_varyings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  captured_varyings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  captured_varyings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptors.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptors.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptors.
  super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vao.m_context = (this->super_TestBase).super_TestCase.m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  vao.m_id = 0xffffffff;
  program.m_compute.m_context = vao.m_context;
  program.m_fragment.m_context = vao.m_context;
  program.m_geometry.m_context = vao.m_context;
  program.m_tess_ctrl.m_context = vao.m_context;
  program.m_tess_eval.m_context = vao.m_context;
  program.m_vertex.m_context = vao.m_context;
  program.m_context = vao.m_context;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xb])
            (this,CONCAT44(in_register_00000034,test_case_index),&captured_varyings);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_4c8,this,test_case_index,5);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_4e8,this,test_case_index,4);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_508,this,test_case_index,2);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_528,this,test_case_index,3);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_4a8,this,test_case_index,1);
  _stream = (pointer)local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stream,0x1b3c1e9);
  Utils::Program::Init
            (&program,(string *)&stream,&local_4c8,&local_4e8,&local_508,&local_528,&local_4a8,
             &captured_varyings,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_stream != local_328) {
    operator_delete(_stream,local_328[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])
                    (this,test_case_index,&program,&stream);
  if ((char)iVar1 == '\0') {
    local_1b0._0_8_ = ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Program inspection failed. Test case: ",0x26);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_558,this,test_case_index);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)local_558,local_550);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Reason: ",10);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)local_578,local_570);
    pTVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_598[0] = local_588;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_598,local_4a8._M_dataplus._M_p,
               local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
    tcu::TestLog::writeKernelSource(pTVar3,(char *)local_598[0]);
    local_468[0] = local_458;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_468,local_508._M_dataplus._M_p,
               local_508._M_dataplus._M_p + local_508._M_string_length);
    tcu::TestLog::writeKernelSource(pTVar3,(char *)local_468[0]);
    local_488[0] = local_478;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_488,local_528._M_dataplus._M_p,
               local_528._M_dataplus._M_p + local_528._M_string_length);
    tcu::TestLog::writeKernelSource(pTVar3,(char *)local_488[0]);
    local_3e8[0] = local_3d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3e8,local_4e8._M_dataplus._M_p,
               local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
    tcu::TestLog::writeKernelSource(pTVar3,(char *)local_3e8[0]);
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_408,local_4c8._M_dataplus._M_p,
               local_4c8._M_dataplus._M_p + local_4c8._M_string_length);
    tcu::TestLog::writeKernelSource(pTVar3,(char *)local_408[0]);
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    if (local_3e8[0] != local_3d8) {
      operator_delete(local_3e8[0],local_3d8[0] + 1);
    }
    if (local_488[0] != local_478) {
      operator_delete(local_488[0],local_478[0] + 1);
    }
    if (local_468[0] != local_458) {
      operator_delete(local_468[0],local_458[0] + 1);
    }
    if (local_598[0] != local_588) {
      operator_delete(local_598[0],local_588[0] + 1);
    }
    if (local_578 != local_568) {
      operator_delete(local_578,local_568[0] + 1);
    }
    if (local_558 != local_548) {
      operator_delete(local_558,local_548[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    std::ios_base::~ios_base(local_2b8);
  }
  else {
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    std::ios_base::~ios_base(local_2b8);
    iVar1 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1680))(program.m_id);
    dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(dVar2,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0xbcb);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[10])
              (this,test_case_index,&descriptors);
    cleanBuffers(this);
    prepareBuffers(this,&descriptors,&buffers);
    Utils::VertexArray::Init(&vao);
    iVar1 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0xd8))(vao.m_id);
    dVar2 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
    glu::checkError(dVar2,"BindVertexArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0xe37);
    iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
                      (this,(ulong)(program.m_tess_eval.m_id != 0),test_case_index);
    if ((char)iVar1 == '\0') {
      pTVar3 = ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
      _stream = (pointer)local_328;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stream,local_4a8._M_dataplus._M_p,
                 local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,_stream);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,local_508._M_dataplus._M_p,
                 local_508._M_dataplus._M_p + local_508._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_1b0._0_8_);
      local_558 = local_548;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_558,local_528._M_dataplus._M_p,
                 local_528._M_dataplus._M_p + local_528._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_558);
      local_578 = local_568;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,local_4e8._M_dataplus._M_p,
                 local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_578);
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_598,local_4c8._M_dataplus._M_p,
                 local_4c8._M_dataplus._M_p + local_4c8._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_598[0]);
    }
    else {
      iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
                [0x10])(this,&buffers);
      bVar4 = true;
      if ((char)iVar1 != '\0') goto LAB_0089a78d;
      pTVar3 = ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
      _stream = (pointer)local_328;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stream,local_4a8._M_dataplus._M_p,
                 local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,_stream);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,local_508._M_dataplus._M_p,
                 local_508._M_dataplus._M_p + local_508._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_1b0._0_8_);
      local_558 = local_548;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_558,local_528._M_dataplus._M_p,
                 local_528._M_dataplus._M_p + local_528._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_558);
      local_578 = local_568;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,local_4e8._M_dataplus._M_p,
                 local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_578);
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_598,local_4c8._M_dataplus._M_p,
                 local_4c8._M_dataplus._M_p + local_4c8._M_string_length);
      tcu::TestLog::writeKernelSource(pTVar3,(char *)local_598[0]);
    }
    if (local_598[0] != local_588) {
      operator_delete(local_598[0],local_588[0] + 1);
    }
    if (local_578 != local_568) {
      operator_delete(local_578,local_568[0] + 1);
    }
    if (local_558 != local_548) {
      operator_delete(local_558,local_548[0] + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_stream != local_328) {
      operator_delete(_stream,local_328[0]._M_allocated_capacity + 1);
    }
  }
  bVar4 = false;
LAB_0089a78d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  Utils::VertexArray::~VertexArray(&vao);
  Utils::Program::~Program(&program);
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::~vector(&descriptors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&captured_varyings);
  bufferCollection::~bufferCollection(&buffers);
  return bVar4;
}

Assistant:

bool BufferTestBase::testCase(GLuint test_case_index)
{
	try
	{
		bufferCollection		   buffers;
		Utils::Program::NameVector captured_varyings;
		bufferDescriptor::Vector   descriptors;
		Utils::Program			   program(m_context);
		Utils::VertexArray		   vao(m_context);

		/* Get captured varyings */
		getCapturedVaryings(test_case_index, captured_varyings);

		/* Get shader sources */
		const std::string& fragment_shader  = getShaderSource(test_case_index, Utils::Shader::FRAGMENT);
		const std::string& geometry_shader  = getShaderSource(test_case_index, Utils::Shader::GEOMETRY);
		const std::string& tess_ctrl_shader = getShaderSource(test_case_index, Utils::Shader::TESS_CTRL);
		const std::string& tess_eval_shader = getShaderSource(test_case_index, Utils::Shader::TESS_EVAL);
		const std::string& vertex_shader	= getShaderSource(test_case_index, Utils::Shader::VERTEX);

		/* Set up program */
		program.Init("" /* compute_shader */, fragment_shader, geometry_shader, tess_ctrl_shader, tess_eval_shader,
					 vertex_shader, captured_varyings, true, false /* is_separable */);

		/* Inspection */
		{
			std::stringstream stream;
			if (false == inspectProgram(test_case_index, program, stream))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Program inspection failed. Test case: " << getTestCaseName(test_case_index)
					<< ". Reason: " << stream.str() << tcu::TestLog::EndMessage
					<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
					<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
					<< tcu::TestLog::KernelSource(fragment_shader);

				return false;
			}
		}

		program.Use();

		/* Set up buffers */
		getBufferDescriptors(test_case_index, descriptors);
		cleanBuffers();
		prepareBuffers(descriptors, buffers);

		/* Set up vao */
		vao.Init();
		vao.Bind();

		/* Draw */
		bool result = executeDrawCall((program.m_tess_eval.m_id != 0), test_case_index);

#if USE_NSIGHT
		m_context.getRenderContext().postIterate();
#endif

		if (false == result)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
				<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
				<< tcu::TestLog::KernelSource(fragment_shader);

			return false;
		}

		/* Verify result */
		if (false == verifyBuffers(buffers))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
				<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
				<< tcu::TestLog::KernelSource(fragment_shader);

			return false;
		}
	}
	catch (Utils::Shader::InvalidSourceException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}
	catch (Utils::Program::BuildException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}

	/* Done */
	return true;
}